

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,
          bool inside_block_like_struct_scope,bool inside_struct_scope)

{
  uint uVar1;
  pointer pcVar2;
  size_t sVar3;
  Variant *pVVar4;
  bool bVar5;
  bool bVar6;
  SPIRType *type;
  long *plVar7;
  SPIRConstantOp *pSVar8;
  SPIRConstant *c_00;
  size_type sVar9;
  size_type *psVar10;
  char (*ts_1) [6];
  _func_int **pp_Var11;
  char (*ts_1_00) [4];
  char *pcVar12;
  byte bVar13;
  SPIRType *this_00;
  char *pcVar14;
  char (*in_R9) [2];
  TypedID<(spirv_cross::Types)3> *pTVar15;
  uint32_t index;
  long lVar16;
  ulong uVar17;
  SPIRType tmp_type;
  string local_1d0;
  string local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_188;
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_170;
  uint *local_160;
  size_t sStack_158;
  size_t local_150;
  uint local_148 [8];
  bool *local_128;
  size_t sStack_120;
  size_t local_118;
  bool local_110 [8];
  uint32_t local_108;
  undefined2 local_104;
  StorageClass local_100;
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t sStack_f0;
  size_t local_e8;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t sStack_b8;
  size_t local_b0;
  uint local_a8 [8];
  TypeID local_88;
  undefined8 local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(c->super_IVariant).field_0xc);
  bVar5 = Compiler::type_is_top_level_pointer(&this->super_Compiler,type);
  if (bVar5) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->backend).null_pointer_literal._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->backend).null_pointer_literal._M_string_length);
    return __return_storage_ptr__;
  }
  if ((c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size
      == 0) {
    if ((*(int *)&(type->super_IVariant).field_0xc != 0xf) ||
       ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0)) {
      if ((c->m).columns == 1) {
        (*(this->super_Compiler)._vptr_Compiler[0x19])(__return_storage_ptr__,this,c,0);
        if (!inside_struct_scope) {
          return __return_storage_ptr__;
        }
        if ((this->backend).boolean_in_struct_remapped_type == Boolean) {
          return __return_storage_ptr__;
        }
        if (*(int *)&(type->super_IVariant).field_0xc != 2) {
          return __return_storage_ptr__;
        }
        SPIRType::SPIRType((SPIRType *)local_180,type);
        local_180._12_4_ = (this->backend).boolean_in_struct_remapped_type;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1b0,this,local_180,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1d0,(spirv_cross *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37dfb0,
                   (char (*) [2])__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36641e,
                   in_R9);
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_180,this,type,0);
        plVar7 = (long *)::std::__cxx11::string::append(local_180);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar10) {
          lVar16 = plVar7[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar16;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
        }
        __return_storage_ptr__->_M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_);
        }
        if ((c->m).columns != 0) {
          uVar17 = 0;
          do {
            uVar1 = (c->m).id[uVar17].id;
            if (uVar1 == 0) {
              (*(this->super_Compiler)._vptr_Compiler[0x19])(local_180,this,c,uVar17 & 0xffffffff);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
            }
            else {
              (*(this->super_Compiler)._vptr_Compiler[6])(local_180,this,(ulong)uVar1,1);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
            }
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_);
            }
            uVar17 = uVar17 + 1;
            if (uVar17 < (c->m).columns) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          } while (uVar17 < (c->m).columns);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (!inside_struct_scope) {
          return __return_storage_ptr__;
        }
        if ((this->backend).boolean_in_struct_remapped_type == Boolean) {
          return __return_storage_ptr__;
        }
        if (*(int *)&(type->super_IVariant).field_0xc != 2) {
          return __return_storage_ptr__;
        }
        SPIRType::SPIRType((SPIRType *)local_180,type);
        local_180._12_4_ = (this->backend).boolean_in_struct_remapped_type;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1b0,this,local_180,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1d0,(spirv_cross *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37dfb0,
                   (char (*) [2])__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36641e,
                   in_R9);
      }
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      local_180._0_8_ = &PTR__SPIRType_003fd210;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      sStack_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      sStack_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      sStack_120 = 0;
      if (local_128 != local_110) {
        free(local_128);
      }
      sStack_158 = 0;
      if (local_160 == local_148) {
        return __return_storage_ptr__;
      }
      free(local_160);
      return __return_storage_ptr__;
    }
    if ((this->backend).supports_empty_struct == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar14 = "{ }";
      pcVar12 = "";
LAB_001e6696:
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar14,pcVar12);
      return __return_storage_ptr__;
    }
    if ((this->backend).use_typed_initializer_list == true) {
      ts_1 = (char (*) [6])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])((spirv_cross *)local_180,this,type);
      join<std::__cxx11::string,char_const(&)[6]>
                (__return_storage_ptr__,(spirv_cross *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"{ 0 }",ts_1);
    }
    else {
      if ((this->backend).use_initializer_list == true) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar14 = "{ 0 }";
        pcVar12 = "";
        goto LAB_001e6696;
      }
      ts_1_00 = (char (*) [4])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])((spirv_cross *)local_180,this,type);
      join<std::__cxx11::string,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35fc80,
                 ts_1_00);
    }
    if ((undefined1 *)local_180._0_8_ == local_180 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_180._0_8_);
    return __return_storage_ptr__;
  }
  local_190 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_190;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar13 = 1;
  if ((inside_block_like_struct_scope) &&
     (bVar5 = Compiler::type_is_top_level_array(&this->super_Compiler,type), bVar5)) {
    bVar13 = (this->backend).array_is_value_type_in_buffer_blocks;
  }
  if (((((this->backend).use_initializer_list != true) ||
       ((this->backend).use_typed_initializer_list != true)) ||
      (*(int *)&(type->super_IVariant).field_0xc != 0xf)) ||
     (bVar5 = Compiler::type_is_top_level_array(&this->super_Compiler,type), bVar5)) {
    if ((((this->backend).use_initializer_list == true) &&
        ((this->backend).use_typed_initializer_list == true)) &&
       (((this->backend).array_is_value_type == true &&
        (bVar5 = Compiler::type_is_top_level_array(&this->super_Compiler,type),
        (bVar5 & bVar13) == 1)))) {
      local_160 = local_148;
      local_180._8_4_ = 0;
      local_180._0_8_ = &PTR__SPIRType_003fd210;
      local_180._12_4_ = Unknown;
      aStack_170._M_allocated_capacity._0_4_ = 0;
      aStack_170._M_allocated_capacity._4_4_ = 1;
      aStack_170._8_4_ = 1;
      sStack_158 = 0;
      local_150 = 8;
      local_128 = local_110;
      sStack_120 = 0;
      local_118 = 8;
      local_108 = 0;
      local_104._0_1_ = false;
      local_104._1_1_ = false;
      local_100 = StorageClassGeneric;
      local_f8 = local_e0;
      sStack_f0 = 0;
      local_e8 = 8;
      local_c0 = local_a8;
      sStack_b8 = 0;
      local_b0 = 8;
      local_88.id = 0;
      local_70._0_4_ = 0;
      local_70._4_4_ = 0;
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      this_00 = type;
      if (((inside_struct_scope) && ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
         (*(int *)&(type->super_IVariant).field_0xc == 2)) {
        this_00 = (SPIRType *)local_180;
        SPIRType::operator=(this_00,type);
        local_180._12_4_ = (this->backend).boolean_in_struct_remapped_type;
      }
      type_to_glsl_constructor_abi_cxx11_(&local_1b0,this,this_00);
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1b0);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1d0.field_2._M_allocated_capacity = *psVar10;
        local_1d0.field_2._8_8_ = plVar7[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar10;
        local_1d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      SPIRType::~SPIRType((SPIRType *)local_180);
      bVar5 = true;
      goto LAB_001e689e;
    }
    if ((this->backend).use_initializer_list == true) {
      bVar5 = false;
      ::std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x3627aa);
      goto LAB_001e689e;
    }
    type_to_glsl_constructor_abi_cxx11_(&local_1d0,this,type);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_1d0,this,type);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
  }
  pp_Var11 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var11) {
    aStack_170._M_allocated_capacity._0_4_ = SUB84(*pp_Var11,0);
    aStack_170._M_allocated_capacity._4_4_ = (undefined4)((ulong)*pp_Var11 >> 0x20);
    aStack_170._8_4_ = (undefined4)plVar7[3];
    aStack_170._12_4_ = (undefined4)((ulong)plVar7[3] >> 0x20);
    local_180._0_8_ = local_180 + 0x10;
  }
  else {
    aStack_170._M_allocated_capacity._0_4_ = SUB84(*pp_Var11,0);
    aStack_170._M_allocated_capacity._4_4_ = (undefined4)((ulong)*pp_Var11 >> 0x20);
    local_180._0_8_ = (_func_int **)*plVar7;
  }
  local_180._8_4_ = (undefined4)plVar7[1];
  local_180._12_4_ = (undefined4)((ulong)plVar7[1] >> 0x20);
  *plVar7 = (long)pp_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_180);
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  bVar5 = false;
LAB_001e689e:
  sVar3 = (c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
          buffer_size;
  if (sVar3 != 0) {
    pTVar15 = (c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
    local_188 = &(this->super_Compiler).forwarded_temporaries._M_h;
    lVar16 = sVar3 << 2;
    index = 0;
    do {
      uVar17 = (ulong)pTVar15->id;
      if ((uVar17 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size
          ) && (pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
               pVVar4[uVar17].type == TypeConstantOp)) {
        pSVar8 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar4 + uVar17);
      }
      else {
        pSVar8 = (SPIRConstantOp *)0x0;
      }
      if (pSVar8 == (SPIRConstantOp *)0x0) {
        uVar17 = (ulong)pTVar15->id;
        if ((uVar17 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                      buffer_size) &&
           (pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
           pVVar4[uVar17].type == TypeUndef)) {
          Variant::get<spirv_cross::SPIRUndef>(pVVar4 + uVar17);
          (*(this->super_Compiler)._vptr_Compiler[6])(local_180,this,(ulong)pTVar15->id,1);
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
        }
        else {
          c_00 = Variant::get<spirv_cross::SPIRConstant>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + pTVar15->id);
          if (c_00->specialization == true) {
            local_180._0_4_ = pTVar15->id;
            sVar9 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(local_188,(key_type *)local_180);
            if (sVar9 == 0) {
              (*(this->super_Compiler)._vptr_Compiler[6])(local_180,this,(ulong)pTVar15->id,1);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
              goto LAB_001e6a3f;
            }
          }
          bVar6 = Compiler::type_is_top_level_array(&this->super_Compiler,type);
          if (!bVar6 && *(int *)&(type->super_IVariant).field_0xc == 0xf) {
            inside_block_like_struct_scope =
                 Compiler::has_member_decoration
                           (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,index,
                            DecorationOffset);
          }
          if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
            inside_struct_scope = true;
          }
          constant_expression_abi_cxx11_
                    ((string *)local_180,this,c_00,(bool)(inside_block_like_struct_scope & 1),
                     (bool)(inside_struct_scope & 1));
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x18])(local_180,this,pSVar8);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
      }
LAB_001e6a3f:
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
      if (pTVar15 !=
          (c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr +
          ((c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
           buffer_size - 1)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      index = index + 1;
      pTVar15 = pTVar15 + 1;
      lVar16 = lVar16 + -4;
    } while (lVar16 != 0);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (bVar5) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression(const SPIRConstant &c,
                                         bool inside_block_like_struct_scope,
                                         bool inside_struct_scope)
{
	auto &type = get<SPIRType>(c.constant_type);

	if (type_is_top_level_pointer(type))
	{
		return backend.null_pointer_literal;
	}
	else if (!c.subconstants.empty())
	{
		// Handles Arrays and structures.
		string res;

		// Only consider the decay if we are inside a struct scope where we are emitting a member with Offset decoration.
		// Outside a block-like struct declaration, we can always bind to a constant array with templated type.
		// Should look at ArrayStride here as well, but it's possible to declare a constant struct
		// with Offset = 0, using no ArrayStride on the enclosed array type.
		// A particular CTS test hits this scenario.
		bool array_type_decays = inside_block_like_struct_scope &&
		                         type_is_top_level_array(type) &&
		                         !backend.array_is_value_type_in_buffer_blocks;

		// Allow Metal to use the array<T> template to make arrays a value type
		bool needs_trailing_tracket = false;
		if (backend.use_initializer_list && backend.use_typed_initializer_list && type.basetype == SPIRType::Struct &&
		    !type_is_top_level_array(type))
		{
			res = type_to_glsl_constructor(type) + "{ ";
		}
		else if (backend.use_initializer_list && backend.use_typed_initializer_list && backend.array_is_value_type &&
		         type_is_top_level_array(type) && !array_type_decays)
		{
			const auto *p_type = &type;
			SPIRType tmp_type;

			if (inside_struct_scope &&
			    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
			    type.basetype == SPIRType::Boolean)
			{
				tmp_type = type;
				tmp_type.basetype = backend.boolean_in_struct_remapped_type;
				p_type = &tmp_type;
			}

			res = type_to_glsl_constructor(*p_type) + "({ ";
			needs_trailing_tracket = true;
		}
		else if (backend.use_initializer_list)
		{
			res = "{ ";
		}
		else
		{
			res = type_to_glsl_constructor(type) + "(";
		}

		uint32_t subconstant_index = 0;
		for (auto &elem : c.subconstants)
		{
			if (auto *op = maybe_get<SPIRConstantOp>(elem))
			{
				res += constant_op_expression(*op);
			}
			else if (maybe_get<SPIRUndef>(elem) != nullptr)
			{
				res += to_name(elem);
			}
			else
			{
				auto &subc = get<SPIRConstant>(elem);
				if (subc.specialization && !expression_is_forwarded(elem))
					res += to_name(elem);
				else
				{
					if (!type_is_top_level_array(type) && type.basetype == SPIRType::Struct)
					{
						// When we get down to emitting struct members, override the block-like information.
						// For constants, we can freely mix and match block-like state.
						inside_block_like_struct_scope =
						    has_member_decoration(type.self, subconstant_index, DecorationOffset);
					}

					if (type.basetype == SPIRType::Struct)
						inside_struct_scope = true;

					res += constant_expression(subc, inside_block_like_struct_scope, inside_struct_scope);
				}
			}

			if (&elem != &c.subconstants.back())
				res += ", ";

			subconstant_index++;
		}

		res += backend.use_initializer_list ? " }" : ")";
		if (needs_trailing_tracket)
			res += ")";

		return res;
	}
	else if (type.basetype == SPIRType::Struct && type.member_types.size() == 0)
	{
		// Metal tessellation likes empty structs which are then constant expressions.
		if (backend.supports_empty_struct)
			return "{ }";
		else if (backend.use_typed_initializer_list)
			return join(type_to_glsl(type), "{ 0 }");
		else if (backend.use_initializer_list)
			return "{ 0 }";
		else
			return join(type_to_glsl(type), "(0)");
	}
	else if (c.columns() == 1)
	{
		auto res = constant_expression_vector(c, 0);

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
	else
	{
		string res = type_to_glsl(type) + "(";
		for (uint32_t col = 0; col < c.columns(); col++)
		{
			if (c.specialization_constant_id(col) != 0)
				res += to_name(c.specialization_constant_id(col));
			else
				res += constant_expression_vector(c, col);

			if (col + 1 < c.columns())
				res += ", ";
		}
		res += ")";

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
}